

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__read_and_seek_residual(ma_dr_flac_bs *bs,ma_uint32 blockSize,ma_uint32 order)

{
  ma_bool32 mVar1;
  uint uVar2;
  uint in_EDX;
  uint in_ESI;
  ma_dr_flac_bs *in_RDI;
  ma_uint8 unencodedBitsPerSample;
  ma_uint8 riceParam;
  ma_uint32 partitionsRemaining;
  ma_uint32 samplesInPartition;
  ma_uint8 partitionOrder;
  ma_uint8 residualMethod;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  byte in_stack_ffffffffffffffe6;
  char in_stack_ffffffffffffffe7;
  ma_bool32 local_4;
  
  mVar1 = ma_dr_flac__read_uint8
                    (in_RDI,in_ESI,
                     (ma_uint8 *)
                     CONCAT17(in_stack_ffffffffffffffe7,
                              CONCAT16(in_stack_ffffffffffffffe6,
                                       CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                                      )));
  if (mVar1 == 0) {
    local_4 = 0;
  }
  else if ((in_stack_ffffffffffffffe7 == '\0') || (in_stack_ffffffffffffffe7 == '\x01')) {
    mVar1 = ma_dr_flac__read_uint8
                      (in_RDI,in_ESI,
                       (ma_uint8 *)
                       CONCAT17(in_stack_ffffffffffffffe7,
                                CONCAT16(in_stack_ffffffffffffffe6,
                                         CONCAT24(in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0))));
    if (mVar1 == 0) {
      local_4 = 0;
    }
    else if (in_stack_ffffffffffffffe6 < 9) {
      if (in_EDX < in_ESI / (uint)(1 << (in_stack_ffffffffffffffe6 & 0x1f))) {
        uVar2 = in_ESI / (uint)(1 << (in_stack_ffffffffffffffe6 & 0x1f)) - in_EDX;
        local_24 = 1 << (in_stack_ffffffffffffffe6 & 0x1f);
        while( true ) {
          if (in_stack_ffffffffffffffe7 == '\0') {
            mVar1 = ma_dr_flac__read_uint8
                              (in_RDI,in_ESI,
                               (ma_uint8 *)
                               (ulong)CONCAT16(in_stack_ffffffffffffffe6,
                                               CONCAT24(in_stack_ffffffffffffffe4,uVar2)));
            if (mVar1 == 0) {
              return 0;
            }
          }
          else if ((in_stack_ffffffffffffffe7 == '\x01') &&
                  (mVar1 = ma_dr_flac__read_uint8
                                     (in_RDI,in_ESI,
                                      (ma_uint8 *)
                                      CONCAT17(1,CONCAT16(in_stack_ffffffffffffffe6,
                                                          CONCAT24(in_stack_ffffffffffffffe4,uVar2))
                                              )), mVar1 == 0)) {
            return 0;
          }
          mVar1 = ma_dr_flac__read_and_seek_residual__rice(in_RDI,in_ESI,(ma_uint8)(in_EDX >> 0x18))
          ;
          if (mVar1 == 0) {
            return 0;
          }
          if (local_24 == 1) break;
          local_24 = local_24 + -1;
          uVar2 = in_ESI / (uint)(1 << (in_stack_ffffffffffffffe6 & 0x1f));
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static ma_bool32 ma_dr_flac__read_and_seek_residual(ma_dr_flac_bs* bs, ma_uint32 blockSize, ma_uint32 order)
{
    ma_uint8 residualMethod;
    ma_uint8 partitionOrder;
    ma_uint32 samplesInPartition;
    ma_uint32 partitionsRemaining;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(blockSize != 0);
    if (!ma_dr_flac__read_uint8(bs, 2, &residualMethod)) {
        return MA_FALSE;
    }
    if (residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE && residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
        return MA_FALSE;
    }
    if (!ma_dr_flac__read_uint8(bs, 4, &partitionOrder)) {
        return MA_FALSE;
    }
    if (partitionOrder > 8) {
        return MA_FALSE;
    }
    if ((blockSize / (1 << partitionOrder)) <= order) {
        return MA_FALSE;
    }
    samplesInPartition = (blockSize / (1 << partitionOrder)) - order;
    partitionsRemaining = (1 << partitionOrder);
    for (;;)
    {
        ma_uint8 riceParam = 0;
        if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE) {
            if (!ma_dr_flac__read_uint8(bs, 4, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 15) {
                riceParam = 0xFF;
            }
        } else if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
            if (!ma_dr_flac__read_uint8(bs, 5, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 31) {
                riceParam = 0xFF;
            }
        }
        if (riceParam != 0xFF) {
            if (!ma_dr_flac__read_and_seek_residual__rice(bs, samplesInPartition, riceParam)) {
                return MA_FALSE;
            }
        } else {
            ma_uint8 unencodedBitsPerSample = 0;
            if (!ma_dr_flac__read_uint8(bs, 5, &unencodedBitsPerSample)) {
                return MA_FALSE;
            }
            if (!ma_dr_flac__seek_bits(bs, unencodedBitsPerSample * samplesInPartition)) {
                return MA_FALSE;
            }
        }
        if (partitionsRemaining == 1) {
            break;
        }
        partitionsRemaining -= 1;
        samplesInPartition = blockSize / (1 << partitionOrder);
    }
    return MA_TRUE;
}